

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O1

void __thiscall
avro::detail::BufferImpl::extractData(BufferImpl *this,BufferImpl *dest,size_type bytes)

{
  data_type **ppdVar1;
  value_type *__x;
  _Elt_pointer pCVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = bytes;
  if (bytes != 0) {
    do {
      __x = (this->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      uVar4 = (long)__x->writePos_ - (long)__x->readPos_;
      std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::push_back
                (&dest->readChunks_,__x);
      uVar3 = uVar5 - uVar4;
      if (uVar5 < uVar4) {
        ppdVar1 = &((this->readChunks_).
                    super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur)->readPos_;
        *ppdVar1 = *ppdVar1 + uVar5;
        pCVar2 = (dest->readChunks_).
                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pCVar2 == (dest->readChunks_).
                      super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_first) {
          pCVar2 = (dest->readChunks_).
                   super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
        }
        pCVar2[-1].writePos_ = pCVar2[-1].writePos_ + (uVar5 - uVar4);
        uVar3 = 0;
      }
      else {
        std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::pop_front
                  (&this->readChunks_);
      }
      uVar5 = uVar3;
    } while (uVar3 != 0);
  }
  this->size_ = this->size_ - bytes;
  dest->size_ = dest->size_ + bytes;
  return;
}

Assistant:

void extractData(BufferImpl &dest, size_type bytes)
    {
        assert(bytes && bytes <= size_);

        size_type bytesToExtract = bytes;
        while( bytesToExtract ) {
          
            size_t currentSize = readChunks_.front().dataSize();
            dest.readChunks_.push_back(readChunks_.front());

            // see if entire chunk was extracted 
            if(currentSize <= bytesToExtract) {
                readChunks_.pop_front();
                bytesToExtract -= currentSize;
            }
            else {
                readChunks_.front().truncateFront(bytesToExtract);
                size_t excess = currentSize - bytesToExtract;
                dest.readChunks_.back().truncateBack(excess);
                bytesToExtract = 0;
            }
        }

        size_ -= bytes;
        dest.size_ += bytes;
    }